

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O2

bool __thiscall chrono::ChOptimizerHybrid::DoOptimize(ChOptimizerHybrid *this)

{
  undefined1 auVar1 [16];
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  ChOptimizerLocal *pCVar5;
  _func_int *p_Var6;
  undefined1 auVar7 [16];
  long lVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  ChLog *pCVar12;
  void *__ptr;
  ChOptimizerGenetic *pCVar13;
  ulong uVar14;
  
  bVar9 = (this->super_ChOptimizer).minimize;
  pCVar13 = this->genetic_opt;
  (pCVar13->super_ChOptimizer).minimize = bVar9;
  (this->local_opt->super_ChOptimizer).minimize = bVar9;
  (*(pCVar13->super_ChOptimizer)._vptr_ChOptimizer[6])
            (pCVar13,(ulong)(uint)(this->super_ChOptimizer).C_vars);
  (*(this->local_opt->super_ChOptimizer)._vptr_ChOptimizer[6])
            (this->local_opt,(ulong)(uint)(this->super_ChOptimizer).C_vars);
  pdVar2 = (this->super_ChOptimizer).xv;
  pCVar13 = this->genetic_opt;
  (pCVar13->super_ChOptimizer).xv = pdVar2;
  pdVar3 = (this->super_ChOptimizer).xv_sup;
  (pCVar13->super_ChOptimizer).xv_sup = pdVar3;
  pdVar4 = (this->super_ChOptimizer).xv_inf;
  (pCVar13->super_ChOptimizer).xv_inf = pdVar4;
  pCVar5 = this->local_opt;
  (pCVar5->super_ChOptimizer).xv = pdVar2;
  (pCVar5->super_ChOptimizer).xv_sup = pdVar3;
  (pCVar5->super_ChOptimizer).xv_inf = pdVar4;
  p_Var6 = (this->super_ChOptimizer).break_funct;
  (pCVar13->super_ChOptimizer).break_funct = p_Var6;
  (pCVar5->super_ChOptimizer).break_funct = p_Var6;
  iVar10 = (this->super_ChOptimizer).break_cycles;
  (pCVar13->super_ChOptimizer).break_cycles = iVar10;
  (pCVar5->super_ChOptimizer).break_cycles = iVar10;
  if (this->use_genetic == true) {
    this->current_phase = 1;
    iVar10 = (*(pCVar13->super_ChOptimizer)._vptr_ChOptimizer[0xb])();
    if ((char)iVar10 != '\0') {
      pCVar13 = this->genetic_opt;
      lVar8 = (pCVar13->super_ChOptimizer).grad_evaluations;
      (this->super_ChOptimizer).fx_evaluations = (pCVar13->super_ChOptimizer).fx_evaluations;
      (this->super_ChOptimizer).grad_evaluations = lVar8;
      (this->super_ChOptimizer).opt_fx = (pCVar13->super_ChOptimizer).opt_fx;
      goto LAB_00d24d8b;
    }
    pCVar13 = this->genetic_opt;
LAB_00d24ee1:
    strcpy((this->super_ChOptimizer).err_message,(pCVar13->super_ChOptimizer).err_message);
    bVar9 = false;
  }
  else {
LAB_00d24d8b:
    if (this->use_local == true) {
      this->current_phase = 2;
      iVar10 = (*(this->local_opt->super_ChOptimizer)._vptr_ChOptimizer[0xb])();
      if ((char)iVar10 == '\0') {
        pCVar13 = (ChOptimizerGenetic *)this->local_opt;
        goto LAB_00d24ee1;
      }
      pCVar5 = this->local_opt;
      auVar7._0_8_ = (pCVar5->super_ChOptimizer).fx_evaluations;
      auVar7._8_8_ = (pCVar5->super_ChOptimizer).grad_evaluations;
      auVar1._0_8_ = (this->genetic_opt->super_ChOptimizer).fx_evaluations;
      auVar1._8_8_ = (this->genetic_opt->super_ChOptimizer).grad_evaluations;
      auVar7 = vpaddq_avx(auVar7,auVar1);
      (this->super_ChOptimizer).fx_evaluations = auVar7._0_8_;
      (this->super_ChOptimizer).grad_evaluations = auVar7._8_8_;
      (this->super_ChOptimizer).opt_fx = (pCVar5->super_ChOptimizer).opt_fx;
    }
    this->current_phase = 0;
    builtin_strncpy((this->super_ChOptimizer).err_message,
                    "Ok, hybrid optimization has been terminated",0x2c);
    pCVar12 = GetLog();
    ChStreamOutAscii::operator<<
              (&pCVar12->super_ChStreamOutAscii,"\n\nHYBRID OPTIMIZATION TERMINATED.");
    pCVar12 = GetLog();
    ChStreamOutAscii::operator<<
              (&pCVar12->super_ChStreamOutAscii,"\nCurrent system variables after optimization:");
    uVar11 = (*(this->super_ChOptimizer)._vptr_ChOptimizer[7])(this);
    __ptr = calloc((long)(int)uVar11,8);
    for (uVar14 = 0; (~((int)uVar11 >> 0x1f) & uVar11) != uVar14; uVar14 = uVar14 + 1) {
      pCVar12 = GetLog();
      ChStreamOutAscii::operator<<(&pCVar12->super_ChStreamOutAscii,"\n   ");
      pCVar12 = GetLog();
      ChStreamOutAscii::operator<<
                (&pCVar12->super_ChStreamOutAscii,*(double *)((long)__ptr + uVar14 * 8));
    }
    free(__ptr);
    pCVar12 = GetLog();
    ChStreamOutAscii::operator<<
              (&pCVar12->super_ChStreamOutAscii,"\n with objective fx obtained equal to = ");
    pCVar12 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar12->super_ChStreamOutAscii,(this->super_ChOptimizer).opt_fx);
    pCVar12 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar12->super_ChStreamOutAscii,"\n\n\n");
    bVar9 = true;
  }
  return bVar9;
}

Assistant:

bool ChOptimizerHybrid::DoOptimize() {
    // set common optimization settings
    genetic_opt->minimize = minimize;
    local_opt->minimize = minimize;
    genetic_opt->SetNumOfVars(C_vars);
    local_opt->SetNumOfVars(C_vars);
    genetic_opt->SetXv(xv);
    genetic_opt->SetXv_sup(xv_sup);
    genetic_opt->SetXv_inf(xv_inf);
    local_opt->SetXv(xv);
    local_opt->SetXv_sup(xv_sup);
    local_opt->SetXv_inf(xv_inf);

    genetic_opt->break_funct = break_funct;
    local_opt->break_funct = break_funct;
    genetic_opt->break_cycles = break_cycles;
    local_opt->break_cycles = break_cycles;

    // 1)  optimization with genetic method

    if (use_genetic) {
        current_phase = 1;

        if (!genetic_opt->Optimize()) {
            strcpy(err_message, genetic_opt->err_message);
            return false;
        }

        fx_evaluations = genetic_opt->fx_evaluations;
        grad_evaluations = genetic_opt->grad_evaluations;
        opt_fx = genetic_opt->opt_fx;
    }

    // 2)  optimization with gradient method

    if (use_local) {
        current_phase = 2;

        if (!local_opt->Optimize()) {
            strcpy(err_message, local_opt->err_message);
            return false;
        }

        fx_evaluations = genetic_opt->fx_evaluations + local_opt->fx_evaluations;
        grad_evaluations = genetic_opt->grad_evaluations + local_opt->grad_evaluations;
        opt_fx = local_opt->opt_fx;
    }

    current_phase = 0;

    // set class values after optimization
    strcpy(err_message, "Ok, hybrid optimization has been terminated");

    // on termination, reset the system at the value of the fenotypes of the best indiv.
    GetLog() << "\n\nHYBRID OPTIMIZATION TERMINATED.";
    GetLog() << "\nCurrent system variables after optimization:";
    int nv = GetNumOfVars();
    double* myvars = (double*)calloc(nv, sizeof(double));
    // System_to_Vars(myvars);
    for (int mvar = 0; mvar < nv; mvar++) {
        GetLog() << "\n   ";
        GetLog() << myvars[mvar];
    }
    free(myvars);  // delete the array of variables

    GetLog() << "\n with objective fx obtained equal to = ";
    GetLog() << opt_fx;
    GetLog() << "\n\n\n";

    return true;
}